

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

void __thiscall
ChainstateManager::ChainstateManager
          (ChainstateManager *this,SignalInterrupt *interrupt,Options *options,
          Options *blockman_options)

{
  long lVar1;
  undefined8 in_RSI;
  SignalInterrupt *in_RDI;
  long in_FS_OFFSET;
  BlockManagerOpts *in_stack_fffffffffffffef8;
  Options *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  VersionBitsCache *this_00;
  ChainstateManagerOpts *in_stack_ffffffffffffff20;
  ChainstateManagerOpts *this_01;
  SignalInterrupt *pSVar2;
  Options *opts;
  SignalInterrupt *interrupt_00;
  BlockManager *in_stack_ffffffffffffff78;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  ValidationCache *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  interrupt_00 = in_RDI;
  std::unique_ptr<Chainstate,std::default_delete<Chainstate>>::
  unique_ptr<std::default_delete<Chainstate>,void>
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)in_stack_fffffffffffffef8);
  opts = (Options *)&interrupt_00->m_pipe_w;
  std::unique_ptr<Chainstate,std::default_delete<Chainstate>>::
  unique_ptr<std::default_delete<Chainstate>,void>
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)in_stack_fffffffffffffef8);
  interrupt_00[1].m_pipe_r = 0;
  interrupt_00[1].m_pipe_w = 0;
  interrupt_00[2].m_flag = (__atomic_base<bool>)0x0;
  *(undefined3 *)&interrupt_00[2].field_0x1 = 0;
  interrupt_00[2].m_pipe_r = 0;
  *(undefined8 *)&interrupt_00[2].m_pipe_w = 0;
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffef8);
  pSVar2 = in_RDI + 4;
  std::
  array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
  ::array((array<std::map<const_CBlockIndex_*,_ThresholdState,_std::less<const_CBlockIndex_*>,_std::allocator<std::pair<const_CBlockIndex_*const,_ThresholdState>_>_>,_29UL>
           *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  CCheckQueue<CScriptCheck>::CCheckQueue
            ((CCheckQueue<FakeCheckCheckCompletion> *)(in_RDI + 0x78),(uint)((ulong)pSVar2 >> 0x20),
             (int)pSVar2);
  in_RDI[0x8d].m_pipe_r = 0;
  in_RDI[0x8d].m_pipe_w = 0;
  in_RDI[0x8e].m_flag = (__atomic_base<bool>)0x0;
  *(undefined3 *)&in_RDI[0x8e].field_0x1 = 0;
  in_RDI[0x8e].m_pipe_r = 0;
  *(undefined8 *)&in_RDI[0x8e].m_pipe_w = 0;
  in_RDI[0x8f].m_pipe_r = 0;
  in_RDI[0x8f].m_pipe_w = 0;
  in_RDI[0x90].m_flag = (__atomic_base<bool>)0x0;
  *(undefined3 *)&in_RDI[0x90].field_0x1 = 0;
  in_RDI[0x90].m_pipe_r = 0;
  *(undefined8 *)&in_RDI[0x90].m_pipe_w = 0;
  in_RDI[0x91].m_pipe_r = 0;
  in_RDI[0x91].m_pipe_w = 0;
  in_RDI[0x92].m_flag = (__atomic_base<bool>)0x0;
  *(undefined3 *)&in_RDI[0x92].field_0x1 = 0;
  in_RDI[0x92].m_pipe_r = 0;
  *(undefined8 *)&in_RDI[0x92].m_pipe_w = 0;
  in_RDI[0x93].m_pipe_r = 0;
  in_RDI[0x93].m_pipe_w = 0;
  in_RDI[0x94].m_flag = (__atomic_base<bool>)0x0;
  *(undefined3 *)&in_RDI[0x94].field_0x1 = 0;
  in_RDI[0x94].m_pipe_r = 0;
  *(undefined8 *)&in_RDI[0x94].m_pipe_w = 0;
  this_01 = (ChainstateManagerOpts *)&in_RDI[0x95].m_pipe_r;
  std::function<void_()>::function((function<void_()> *)in_stack_fffffffffffffef8);
  in_RDI[0x98].m_flag = (atomic<bool>)(char)in_RSI;
  *(int3 *)&in_RDI[0x98].field_0x1 = (int3)((ulong)in_RSI >> 8);
  in_RDI[0x98].m_pipe_r = (TokenPipeEnd)(int)((ulong)in_RSI >> 0x20);
  Flatten(in_stack_ffffffffffffff00);
  kernel::ChainstateManagerOpts::ChainstateManagerOpts(this_01,in_stack_ffffffffffffff20);
  this_00 = (VersionBitsCache *)(in_RDI + 0xaa);
  kernel::BlockManagerOpts::BlockManagerOpts
            ((BlockManagerOpts *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
             (BlockManagerOpts *)in_stack_ffffffffffffff00);
  ::node::BlockManager::BlockManager(in_stack_ffffffffffffff78,interrupt_00,opts);
  kernel::BlockManagerOpts::~BlockManagerOpts(in_stack_fffffffffffffef8);
  ValidationCache::ValidationCache
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_fffffffffffffef8,false);
  in_RDI[0x10b].m_pipe_w.m_fd = 1;
  *(undefined4 *)(in_RDI + 0x10c) = 0xffffffff;
  arith_uint256::arith_uint256((arith_uint256 *)in_stack_fffffffffffffef8,0x14af1d3);
  std::set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_>::set
            ((set<CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<CBlockIndex_*>_> *)
             in_stack_fffffffffffffef8);
  in_RDI[0x113].m_pipe_r = 0;
  in_RDI[0x113].m_pipe_w = 0;
  in_RDI[0x114].m_flag = (__atomic_base<bool>)0x0;
  *(undefined3 *)&in_RDI[0x114].field_0x1 = 0;
  in_RDI[0x114].m_pipe_r = 0;
  *(undefined8 *)&in_RDI[0x114].m_pipe_w = 0;
  VersionBitsCache::VersionBitsCache(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ChainstateManager::ChainstateManager(const util::SignalInterrupt& interrupt, Options options, node::BlockManager::Options blockman_options)
    : m_script_check_queue{/*batch_size=*/128, options.worker_threads_num},
      m_interrupt{interrupt},
      m_options{Flatten(std::move(options))},
      m_blockman{interrupt, std::move(blockman_options)},
      m_validation_cache{m_options.script_execution_cache_bytes, m_options.signature_cache_bytes}
{
}